

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoidType.cpp
# Opt level: O0

void __thiscall hdc::VoidType::VoidType(VoidType *this,Token *token)

{
  Token *token_local;
  VoidType *this_local;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220620;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_VOID_TYPE;
  return;
}

Assistant:

VoidType::VoidType(Token& token) {
    this->token = token;
    this->kind = AST_VOID_TYPE;
}